

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleClassifier::SharedDtor(TreeEnsembleClassifier *this)

{
  TreeEnsembleParameters *this_00;
  bool bVar1;
  Arena *pAVar2;
  LogMessage *other;
  TreeEnsembleClassifier *pTVar3;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  TreeEnsembleClassifier *local_10;
  TreeEnsembleClassifier *this_local;
  
  local_10 = this;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  local_49 = 0;
  if (pAVar2 != (Arena *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/TreeEnsemble.pb.cc"
               ,0x4e2);
    local_49 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  pTVar3 = internal_default_instance();
  if ((this != pTVar3) && (this_00 = this->treeensemble_, this_00 != (TreeEnsembleParameters *)0x0))
  {
    TreeEnsembleParameters::~TreeEnsembleParameters(this_00);
    operator_delete(this_00,0x48);
  }
  bVar1 = has_ClassLabels(this);
  if (bVar1) {
    clear_ClassLabels(this);
  }
  return;
}

Assistant:

inline void TreeEnsembleClassifier::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (this != internal_default_instance()) delete treeensemble_;
  if (has_ClassLabels()) {
    clear_ClassLabels();
  }
}